

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  TargetType TVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  cmake *this_01;
  undefined1 auStack_1e8 [16];
  string ll;
  string local_1b8;
  string flagVar;
  
  TVar1 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar1) {
    return false;
  }
  if (TVar1 == STATIC_LIBRARY) {
    return false;
  }
  if (this->Target->HaveInstallRule != true) {
    return false;
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flagVar,"CMAKE_SKIP_RPATH",(allocator<char> *)&ll);
  bVar2 = cmMakefile::IsOn(this_00,&flagVar);
  std::__cxx11::string::~string((string *)&flagVar);
  if (bVar2) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flagVar,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&ll);
  bVar2 = GetPropertyAsBool(this,&flagVar);
  std::__cxx11::string::~string((string *)&flagVar);
  if (bVar2) {
    return false;
  }
  bVar2 = IsChrpathUsed(this,config);
  if (bVar2) {
    return false;
  }
  GetLinkerLanguage(&ll,this,config);
  if (ll._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flagVar,"CMAKE_SHARED_LIBRARY_RUNTIME_",(allocator<char> *)&local_1b8);
    std::__cxx11::string::append((string *)&flagVar);
    std::__cxx11::string::append((char *)&flagVar);
    bVar2 = cmMakefile::IsSet(this->Makefile,&flagVar);
    std::__cxx11::string::~string((string *)&flagVar);
    if (bVar2) {
      bVar2 = HaveBuildTreeRPATH(this,config);
      bVar3 = true;
      if (!bVar2) {
        bVar3 = HaveInstallTreeRPATH(this);
      }
      (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&flagVar);
      bVar2 = std::operator==(&flagVar,"Ninja");
      std::__cxx11::string::~string((string *)&flagVar);
      if ((bVar2 & bVar3) == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&flagVar);
        poVar4 = std::operator<<((ostream *)&flagVar,"The install of the ");
        poVar4 = std::operator<<(poVar4,(string *)&this->Target->Name);
        std::operator<<(poVar4,
                        " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                       );
        this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace((cmGeneratorTarget *)auStack_1e8);
        cmake::IssueMessage(this_01,FATAL_ERROR,&local_1b8,(cmListFileBacktrace *)auStack_1e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1e8 + 8));
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&flagVar);
        bVar3 = true;
      }
      goto LAB_002205aa;
    }
  }
  bVar3 = false;
LAB_002205aa:
  std::__cxx11::string::~string((string *)&ll);
  return bVar3;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}